

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scfx_rep.cpp
# Opt level: O2

void sc_dt::scfx_rep::operator_delete(void *ptr,size_t size)

{
  if (size == 0x28) {
    *(void **)ptr = list;
    list = ptr;
    return;
  }
  ::operator_delete(ptr);
  return;
}

Assistant:

void scfx_rep::operator delete( void* ptr, std::size_t size )
{
    if( size != sizeof( scfx_rep ) )
    {
	::operator delete( ptr );
	return;
    }

    scfx_rep_node* node = static_cast<scfx_rep_node*>( ptr );
    node->next = list;
    list = node;
}